

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<LineNumber>::emplace<LineNumber>
          (QPodArrayOps<LineNumber> *this,qsizetype i,LineNumber *args)

{
  LineNumber **ppLVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  int iVar6;
  undefined4 uVar7;
  LineNumber *pLVar8;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<LineNumber>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00111f45:
    iVar6 = args->line;
    uVar7 = *(undefined4 *)&args->field_0x14;
    qVar4 = args->begin;
    qVar5 = args->end;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<LineNumber>).size != 0);
    QArrayDataPointer<LineNumber>::detachAndGrow
              (&this->super_QArrayDataPointer<LineNumber>,where,1,(LineNumber **)0x0,
               (QArrayDataPointer<LineNumber> *)0x0);
    pLVar8 = createHole(this,where,i,1);
    pLVar8->begin = qVar4;
    pLVar8->end = qVar5;
    pLVar8->line = iVar6;
    *(undefined4 *)&pLVar8->field_0x14 = uVar7;
  }
  else {
    if (((this->super_QArrayDataPointer<LineNumber>).size == i) &&
       (pLVar8 = (this->super_QArrayDataPointer<LineNumber>).ptr,
       (pDVar3->super_QArrayData).alloc - i !=
       ((long)((long)pLVar8 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0x5555555555555555)) {
      uVar7 = *(undefined4 *)&args->field_0x14;
      pLVar8[i].line = args->line;
      *(undefined4 *)&pLVar8[i].field_0x14 = uVar7;
      qVar4 = args->end;
      pLVar8[i].begin = args->begin;
      pLVar8[i].end = qVar4;
    }
    else {
      if ((i != 0) ||
         (pLVar8 = (this->super_QArrayDataPointer<LineNumber>).ptr,
         (LineNumber *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         == pLVar8)) goto LAB_00111f45;
      uVar7 = *(undefined4 *)&args->field_0x14;
      pLVar8[-1].line = args->line;
      *(undefined4 *)&pLVar8[-1].field_0x14 = uVar7;
      qVar4 = args->end;
      pLVar8[-1].begin = args->begin;
      pLVar8[-1].end = qVar4;
      ppLVar1 = &(this->super_QArrayDataPointer<LineNumber>).ptr;
      *ppLVar1 = *ppLVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<LineNumber>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }